

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# options.hpp
# Opt level: O1

void __thiscall ghc::options::nextArg(options *this,size_t skip)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar1;
  pointer pcVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar3;
  long *local_30 [2];
  long local_20 [2];
  
  if (skip != 0) {
    pbVar3 = (this->_argiter)._M_current;
    pbVar1 = (this->_cmdargs).
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    do {
      if (pbVar3 == pbVar1) break;
      pbVar3 = pbVar3 + 1;
      (this->_argiter)._M_current = pbVar3;
      skip = skip - 1;
    } while (skip != 0);
  }
  if ((this->_argiter)._M_current ==
      (this->_cmdargs).
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    (this->_current)._M_string_length = 0;
    *(this->_current)._M_dataplus._M_p = '\0';
    (this->_next)._M_string_length = 0;
    *(this->_next)._M_dataplus._M_p = '\0';
  }
  else {
    std::__cxx11::string::_M_assign((string *)&this->_current);
    pbVar3 = (this->_argiter)._M_current;
    local_30[0] = local_20;
    if (pbVar3 + 1 ==
        (this->_cmdargs).
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
      std::__cxx11::string::_M_construct<char_const*>((string *)local_30,"");
    }
    else {
      pcVar2 = pbVar3[1]._M_dataplus._M_p;
      std::__cxx11::string::_M_construct<char*>
                ((string *)local_30,pcVar2,pcVar2 + pbVar3[1]._M_string_length);
    }
    std::__cxx11::string::_M_assign((string *)&this->_next);
    if (local_30[0] != local_20) {
      operator_delete(local_30[0],local_20[0] + 1);
    }
  }
  return;
}

Assistant:

void nextArg(size_t skip = 1)
    {
        while (skip && _argiter != _cmdargs.end()) {
            ++_argiter;
            --skip;
        }
        if (_argiter != _cmdargs.end()) {
            _current = *_argiter;
            _next = (_argiter+1) != _cmdargs.end() ? *(_argiter+1) : "";
        }
        else {
            _current.clear();
            _next.clear();
        }
    }